

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O0

_Bool al_get_mouse_cursor_position(int *ret_x,int *ret_y)

{
  ALLEGRO_SYSTEM *pAVar1;
  int *in_RSI;
  int *in_RDI;
  ALLEGRO_SYSTEM *alsys;
  _Bool local_1;
  
  pAVar1 = al_get_system_driver();
  if (pAVar1->vt->get_cursor_position == (_func__Bool_int_ptr_int_ptr *)0x0) {
    *in_RDI = 0;
    *in_RSI = 0;
    local_1 = false;
  }
  else {
    local_1 = (*pAVar1->vt->get_cursor_position)(in_RDI,in_RSI);
  }
  return local_1;
}

Assistant:

bool al_get_mouse_cursor_position(int *ret_x, int *ret_y)
{
   ALLEGRO_SYSTEM *alsys = al_get_system_driver();
   ASSERT(ret_x);
   ASSERT(ret_y);

   if (alsys->vt->get_cursor_position) {
      return alsys->vt->get_cursor_position(ret_x, ret_y);
   }
   else {
      *ret_x = 0;
      *ret_y = 0;
      return false;
   }
}